

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_byte.h
# Opt level: O0

void RansDecAdvance(RansState *r,uint8_t **pptr,uint32_t start,uint32_t freq,uint32_t scale_bits)

{
  byte *pbVar1;
  byte *local_38;
  uint8_t *ptr;
  uint32_t x;
  uint32_t mask;
  uint32_t scale_bits_local;
  uint32_t freq_local;
  uint32_t start_local;
  uint8_t **pptr_local;
  RansState *r_local;
  
  ptr._4_4_ = (freq * (*r >> ((byte)scale_bits & 0x1f)) +
              (*r & (1 << ((byte)scale_bits & 0x1f)) - 1U)) - start;
  if (ptr._4_4_ < 0x800000) {
    local_38 = *pptr;
    do {
      pbVar1 = local_38 + 1;
      ptr._4_4_ = ptr._4_4_ << 8 | (uint)*local_38;
      local_38 = pbVar1;
    } while (ptr._4_4_ < 0x800000);
    *pptr = pbVar1;
  }
  *r = ptr._4_4_;
  return;
}

Assistant:

static inline void RansDecAdvance(RansState* r, uint8_t** pptr, uint32_t start, uint32_t freq, uint32_t scale_bits)
{
    uint32_t mask = (1u << scale_bits) - 1;

    // s, x = D(x)
    uint32_t x = *r;
    x = freq * (x >> scale_bits) + (x & mask) - start;

    // renormalize
    if (x < RANS_BYTE_L) {
        uint8_t* ptr = *pptr;
        do x = (x << 8) | *ptr++; while (x < RANS_BYTE_L);
        *pptr = ptr;
    }

    *r = x;
}